

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O2

void __thiscall cppcms::http::response::content_length(response *this,unsigned_long_long len)

{
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Content-Length",&local_51);
  details::itoa<unsigned_long_long>(&local_50,len);
  set_header(this,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void response::content_length(unsigned long long len)
{
	set_header("Content-Length",itoa(len));
}